

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_db.cpp
# Opt level: O2

bool __thiscall Fossilize::ZipDatabase::prepare(ZipDatabase *this)

{
  mz_zip_archive *pZip;
  bool bVar1;
  mz_bool mVar2;
  mz_uint mVar3;
  LogLevel LVar4;
  size_t sVar5;
  ulong uVar6;
  ResourceTag tag;
  uint i;
  mz_uint file_index;
  long lVar7;
  uint64_t value;
  mz_uint local_6d8 [2];
  mz_uint64 local_6d0;
  char local_6c8 [8];
  char acStack_6c0 [8];
  undefined1 local_6b8;
  char local_6a8 [8];
  char acStack_6a0 [8];
  undefined1 local_698;
  char filename [512];
  mz_zip_archive_file_stat s;
  
  if (this->mode != OverWrite) {
    pZip = &this->mz;
    mVar2 = mz_zip_reader_init_file(pZip,(this->path)._M_dataplus._M_p,0);
    if (mVar2 != 0) {
      mVar3 = mz_zip_reader_get_num_files(pZip);
      memset(filename,0,0x200);
      for (file_index = 0; mVar3 != file_index; file_index = file_index + 1) {
        if ((shutdown_requested & 1) != 0) {
          return false;
        }
        mVar2 = mz_zip_reader_is_file_a_directory(pZip,file_index);
        if (mVar2 == 0) {
          mz_zip_reader_get_filename(pZip,file_index,filename,0x200);
          sVar5 = strlen(filename);
          if (((sVar5 == 0x28) && (bVar1 = string_is_hex(filename), bVar1)) &&
             (mVar2 = mz_zip_reader_file_stat(pZip,file_index,&s), mVar2 != 0)) {
            local_698 = 0;
            local_6a8[0] = filename[8];
            local_6a8[1] = filename[9];
            local_6a8[2] = filename[10];
            local_6a8[3] = filename[0xb];
            local_6a8[4] = filename[0xc];
            local_6a8[5] = filename[0xd];
            local_6a8[6] = filename[0xe];
            local_6a8[7] = filename[0xf];
            acStack_6a0[0] = filename[0x10];
            acStack_6a0[1] = filename[0x11];
            acStack_6a0[2] = filename[0x12];
            acStack_6a0[3] = filename[0x13];
            acStack_6a0[4] = filename[0x14];
            acStack_6a0[5] = filename[0x15];
            acStack_6a0[6] = filename[0x16];
            acStack_6a0[7] = filename[0x17];
            local_6b8 = 0;
            local_6c8[0] = filename[0x18];
            local_6c8[1] = filename[0x19];
            local_6c8[2] = filename[0x1a];
            local_6c8[3] = filename[0x1b];
            local_6c8[4] = filename[0x1c];
            local_6c8[5] = filename[0x1d];
            local_6c8[6] = filename[0x1e];
            local_6c8[7] = filename[0x1f];
            acStack_6c0[0] = filename[0x20];
            acStack_6c0[1] = filename[0x21];
            acStack_6c0[2] = filename[0x22];
            acStack_6c0[3] = filename[0x23];
            acStack_6c0[4] = filename[0x24];
            acStack_6c0[5] = filename[0x25];
            acStack_6c0[6] = filename[0x26];
            acStack_6c0[7] = filename[0x27];
            uVar6 = strtoul(local_6a8,(char **)0x0,0x10);
            tag = (ResourceTag)uVar6;
            if (tag < RESOURCE_COUNT) {
              value = strtoull(local_6c8,(char **)0x0,0x10);
              bVar1 = DatabaseInterface::test_resource_filter
                                (&this->super_DatabaseInterface,tag,value);
              if (bVar1) {
                local_6d0 = s.m_uncomp_size;
                local_6d8[0] = file_index;
                std::
                _Hashtable<unsigned_long,std::pair<unsigned_long_const,Fossilize::ZipDatabase::Entry>,std::allocator<std::pair<unsigned_long_const,Fossilize::ZipDatabase::Entry>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                ::_M_emplace<unsigned_long&,Fossilize::ZipDatabase::Entry>
                          ((_Hashtable<unsigned_long,std::pair<unsigned_long_const,Fossilize::ZipDatabase::Entry>,std::allocator<std::pair<unsigned_long_const,Fossilize::ZipDatabase::Entry>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                            *)(this->seen_blobs +
                              (tag & (RESOURCE_APPLICATION_BLOB_LINK|RESOURCE_COMPUTE_PIPELINE))),
                           &value,local_6d8);
              }
            }
          }
        }
      }
      mVar2 = mz_zip_writer_init_from_reader(pZip,(this->path)._M_dataplus._M_p);
      if (mVar2 != 0) {
        this->alive = true;
        return true;
      }
      LVar4 = get_thread_log_level();
      if (((int)LVar4 < 3) &&
         (bVar1 = Internal::log_thread_callback
                            (LOG_ERROR,"Failed to initialize ZIP writer from reader.\n"), !bVar1)) {
        fwrite("Fossilize ERROR: Failed to initialize ZIP writer from reader.\n",0x3e,1,_stderr);
      }
      mz_zip_end(pZip);
      return false;
    }
    if (this->mode == ReadOnly) {
      return true;
    }
  }
  mVar2 = mz_zip_writer_init_file(&this->mz,(this->path)._M_dataplus._M_p,0);
  if (mVar2 != 0) {
    this->alive = true;
    for (lVar7 = 0xa0; lVar7 != 0x2d0; lVar7 = lVar7 + 0x38) {
      std::
      _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_Fossilize::ZipDatabase::Entry>,_std::allocator<std::pair<const_unsigned_long,_Fossilize::ZipDatabase::Entry>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::clear((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_Fossilize::ZipDatabase::Entry>,_std::allocator<std::pair<const_unsigned_long,_Fossilize::ZipDatabase::Entry>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
               *)((long)&(this->super_DatabaseInterface)._vptr_DatabaseInterface + lVar7));
    }
    return true;
  }
  LVar4 = get_thread_log_level();
  if ((int)LVar4 < 3) {
    bVar1 = Internal::log_thread_callback
                      (LOG_ERROR,
                       "Failed to open ZIP archive for writing. Cannot serialize anything to disk.\n"
                      );
    if (bVar1) {
      return false;
    }
    fwrite("Fossilize ERROR: Failed to open ZIP archive for writing. Cannot serialize anything to disk.\n"
           ,0x5c,1,_stderr);
  }
  return false;
}

Assistant:

bool prepare() override
	{
		if (mode != DatabaseMode::OverWrite && mz_zip_reader_init_file(&mz, path.c_str(), 0))
		{
			// We have an existing archive.
			unsigned files = mz_zip_reader_get_num_files(&mz);
			char filename[MZ_ZIP_MAX_ARCHIVE_FILENAME_SIZE] = {};

			for (unsigned i = 0; i < files; i++)
			{
				if (shutdown_requested.load(std::memory_order_relaxed))
					return false;

				if (mz_zip_reader_is_file_a_directory(&mz, i))
					continue;

				mz_zip_reader_get_filename(&mz, i, filename, sizeof(filename));
				size_t len = strlen(filename);
				if (len != FOSSILIZE_BLOB_HASH_LENGTH)
					continue;

				if (!string_is_hex(filename))
					continue;

				mz_zip_archive_file_stat s;
				if (!mz_zip_reader_file_stat(&mz, i, &s))
					continue;

				char tag_str[16 + 1] = {};
				char value_str[16 + 1] = {};
				memcpy(tag_str, filename + FOSSILIZE_BLOB_HASH_LENGTH - 32, 16);
				memcpy(value_str, filename + FOSSILIZE_BLOB_HASH_LENGTH - 16, 16);

				auto tag = unsigned(strtoul(tag_str, nullptr, 16));
				if (tag >= RESOURCE_COUNT)
					continue;
				uint64_t value = strtoull(value_str, nullptr, 16);

				if (test_resource_filter(static_cast<ResourceTag>(tag), value))
					seen_blobs[tag].emplace(value, Entry{i, size_t(s.m_uncomp_size)});
			}

			// In-place update the archive. Should we consider emitting a new archive instead?
			if (!mz_zip_writer_init_from_reader(&mz, path.c_str()))
			{
				LOGE_LEVEL("Failed to initialize ZIP writer from reader.\n");
				mz_zip_end(&mz);
				return false;
			}

			alive = true;
		}
		else if (mode != DatabaseMode::ReadOnly)
		{
			if (!mz_zip_writer_init_file(&mz, path.c_str(), 0))
			{
				LOGE_LEVEL("Failed to open ZIP archive for writing. Cannot serialize anything to disk.\n");
				return false;
			}

			alive = true;

			for (auto &blob : seen_blobs)
				blob.clear();
		}

		return true;
	}